

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O0

bool __thiscall hdc::Logger::enabled(Logger *this,LogKind kind)

{
  LogKind kind_local;
  Logger *this_local;
  
  if (kind == LOG_ERROR) {
    this_local._7_1_ = true;
  }
  else if ((kind == LOG_INTERNAL_DRIVER) && ((this->logDriverFlag & 1U) != 0)) {
    this_local._7_1_ = true;
  }
  else if ((kind == LOG_INTERNAL_LEX) && ((this->logLexFlag & 1U) != 0)) {
    this_local._7_1_ = true;
  }
  else if ((kind == LOG_INTERNAL_PARSER) && ((this->logParserFlag & 1U) != 0)) {
    this_local._7_1_ = true;
  }
  else if ((kind == LOG_INTERNAL_SYMBOL_TABLE) && ((this->logSymbolTableFlag & 1U) != 0)) {
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Logger::enabled(LogKind kind) {
    if (kind == LOG_ERROR) return true;
    if (kind == LOG_INTERNAL_DRIVER && logDriverFlag) return true;
    if (kind == LOG_INTERNAL_LEX && logLexFlag) return true;
    if (kind == LOG_INTERNAL_PARSER && logParserFlag) return true;
    if (kind == LOG_INTERNAL_SYMBOL_TABLE && logSymbolTableFlag) return true;

    return false;
}